

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall
FMultiBlockLinesIterator::FMultiBlockLinesIterator
          (FMultiBlockLinesIterator *this,FPortalGroupArray *check,AActor *origin,double checkradius
          )

{
  int startgroup;
  double upperz;
  double local_60;
  DVector3 local_40;
  double local_28;
  double checkradius_local;
  AActor *origin_local;
  FPortalGroupArray *check_local;
  FMultiBlockLinesIterator *this_local;
  
  this->checklist = check;
  local_28 = checkradius;
  checkradius_local = (double)origin;
  origin_local = (AActor *)check;
  check_local = (FPortalGroupArray *)this;
  TVector3<double>::TVector3(&this->checkpoint);
  TVector2<double>::TVector2(&this->offset);
  FBlockLinesIterator::FBlockLinesIterator(&this->blockIterator);
  FBoundingBox::FBoundingBox(&this->bbox);
  AActor::Pos(&local_40,(AActor *)checkradius_local);
  TVector3<double>::operator=(&this->checkpoint,&local_40);
  if (((ulong)(origin_local->super_DThinker).super_DObject._vptr_DObject & 1) == 0) {
    startgroup = *(int *)(*(long *)((long)checkradius_local + 0x110) + 0x1f8);
    upperz = AActor::Top((AActor *)checkradius_local);
    P_CollectConnectedGroups(startgroup,&this->checkpoint,upperz,local_28,this->checklist);
  }
  if ((local_28 != -1.0) || (NAN(local_28))) {
    local_60 = local_28;
  }
  else {
    local_60 = *(double *)((long)checkradius_local + 0x158);
  }
  (this->checkpoint).Z = local_60;
  this->basegroup = (short)*(undefined4 *)(*(long *)((long)checkradius_local + 0x110) + 0x1f8);
  this->startsector = *(sector_t **)((long)checkradius_local + 0x110);
  Reset(this);
  return;
}

Assistant:

FMultiBlockLinesIterator::FMultiBlockLinesIterator(FPortalGroupArray &check, AActor *origin, double checkradius)
	: checklist(check)
{
	checkpoint = origin->Pos();
	if (!check.inited) P_CollectConnectedGroups(origin->Sector->PortalGroup, checkpoint, origin->Top(), checkradius, checklist);
	checkpoint.Z = checkradius == -1? origin->radius : checkradius;
	basegroup = origin->Sector->PortalGroup;
	startsector = origin->Sector;
	Reset();
}